

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::TriageCompareLineSin2Distance<double>
              (Vector3<double> *x,Vector3<double> *a0,Vector3<double> *a1,double r2,
              Vector3<double> *n,double n1,double n2)

{
  double dVar1;
  int iVar2;
  long lVar3;
  Vector3<double> *pVVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  iVar2 = -1;
  if (r2 < 2.0) {
    dVar14 = (r2 * -0.25 + 1.0) * n2 * r2;
    dVar12 = x->c_[0];
    dVar8 = x->c_[1];
    dVar1 = x->c_[2];
    dVar9 = a0->c_[0] - dVar12;
    dVar10 = a0->c_[2] - dVar1;
    dVar6 = a1->c_[0] - dVar12;
    dVar7 = a1->c_[2] - dVar1;
    dVar11 = a0->c_[1] - dVar8;
    dVar13 = a1->c_[1] - dVar8;
    dVar9 = dVar10 * dVar10 + dVar9 * dVar9 + dVar11 * dVar11;
    dVar7 = dVar7 * dVar7 + dVar6 * dVar6 + dVar13 * dVar13;
    pVVar4 = a0;
    dVar6 = dVar9;
    if (dVar7 <= dVar9) {
      pVVar4 = a1;
      dVar6 = dVar7;
      if ((dVar9 == dVar7) && (!NAN(dVar9) && !NAN(dVar7))) {
        lVar3 = 0;
        do {
          dVar10 = *(double *)((long)a0->c_ + lVar3);
          dVar11 = *(double *)((long)a1->c_ + lVar3);
          pVVar4 = a0;
          dVar6 = dVar9;
          if ((dVar10 < dVar11) || (pVVar4 = a1, dVar6 = dVar7, dVar11 < dVar10)) break;
          bVar5 = lVar3 != 0x10;
          lVar3 = lVar3 + 8;
        } while (bVar5);
      }
    }
    dVar12 = n->c_[2] * (dVar1 - pVVar4->c_[2]) +
             (dVar12 - pVVar4->c_[0]) * n->c_[0] + 0.0 + n->c_[1] * (dVar8 - pVVar4->c_[1]);
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar6 = (n1 * 6.964101615137754 + 6.153480596427404e-15) * 1.1102230246251565e-16 * dVar6;
    dVar8 = dVar12 * dVar12 - dVar14;
    dVar12 = dVar12 * dVar12 * 4.440892098500626e-16 + (ABS(dVar12) + ABS(dVar12) + dVar6) * dVar6 +
             dVar14 * 8.881784197001252e-16 + dVar14 * 6.661338147750939e-16;
    iVar2 = 1;
    if (dVar8 <= dVar12) {
      iVar2 = -(uint)(dVar8 < -dVar12);
    }
  }
  return iVar2;
}

Assistant:

int TriageCompareLineSin2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute sin^2(distance to edge) to get the best accuracy
  // when the distance limit is small (e.g., S2::kIntersectionError).
  T n2sin2_r = n2 * r2 * (1 - 0.25 * r2);
  T n2sin2_r_error = 6 * T_ERR * n2sin2_r;
  T ax2, xDn = (x - GetClosestVertex(x, a0, a1, &ax2)).DotProd(n);
  T xDn2 = xDn * xDn;
  const T c1 = (((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) *
                T_ERR * sqrt(ax2));
  T xDn2_error = 4 * T_ERR * xDn2 + (2 * fabs(xDn) + c1) * c1;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to with a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2sin2_r *= x.Norm2();
    n2sin2_r_error += 4 * T_ERR * n2sin2_r;
  } else {
    n2sin2_r_error += 8 * DBL_ERR * n2sin2_r;
  }
  T diff = xDn2 - n2sin2_r;
  T error = xDn2_error + n2sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}